

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall Assimp::SMDImporter::CreateOutputAnimation(SMDImporter *this,int index,string *name)

{
  undefined8 *puVar1;
  double dVar2;
  aiAnimation **ppaVar3;
  char *__s;
  ai_uint32 aVar4;
  uint uVar5;
  aiAnimation *paVar6;
  size_t sVar7;
  aiNodeAnim **ppaVar8;
  aiNodeAnim *paVar9;
  ulong uVar10;
  aiVectorKey *paVar11;
  ulong uVar12;
  aiQuatKey *paVar13;
  aiQuatKey *paVar14;
  ulong uVar15;
  pointer pBVar16;
  pointer pMVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  paVar6 = (aiAnimation *)operator_new(0x448);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mDuration = -1.0;
  paVar6->mTicksPerSecond = 0.0;
  paVar6->mNumChannels = 0;
  paVar6->mChannels = (aiNodeAnim **)0x0;
  paVar6->mNumMeshChannels = 0;
  paVar6->mMeshChannels = (aiMeshAnim **)0x0;
  paVar6->mNumMorphMeshChannels = 0;
  paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  ppaVar3 = this->pScene->mAnimations;
  ppaVar3[index] = paVar6;
  if (name->_M_string_length != 0) {
    __s = (name->_M_dataplus)._M_p;
    sVar7 = strlen(__s);
    aVar4 = (ai_uint32)sVar7;
    if ((int)aVar4 < 0x400) {
      (paVar6->mName).length = aVar4;
      memcpy((paVar6->mName).data,__s,(long)(int)aVar4);
      (paVar6->mName).data[(int)aVar4] = '\0';
    }
  }
  ppaVar3[index]->mDuration = this->dLengthOfAnim;
  ppaVar3[index]->mNumChannels =
       (int)((ulong)((long)(this->asBones).
                           super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39;
  ppaVar3[index]->mTicksPerSecond = 25.0;
  ppaVar8 = (aiNodeAnim **)operator_new__((ulong)ppaVar3[index]->mNumChannels << 3);
  ppaVar3[index]->mChannels = ppaVar8;
  pBVar16 = (this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pBVar16 !=
      (this->asBones).super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar15 = 0;
    do {
      paVar9 = (aiNodeAnim *)operator_new(0x438);
      (paVar9->mNodeName).length = 0;
      (paVar9->mNodeName).data[0] = '\0';
      memset((paVar9->mNodeName).data + 1,0x1b,0x3ff);
      paVar9->mRotationKeys = (aiQuatKey *)0x0;
      paVar9->mNumScalingKeys = 0;
      *(undefined8 *)&paVar9->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar9->mPositionKeys + 4) = 0;
      paVar9->mScalingKeys = (aiVectorKey *)0x0;
      paVar9->mPreState = aiAnimBehaviour_DEFAULT;
      paVar9->mPostState = aiAnimBehaviour_DEFAULT;
      ppaVar8[uVar15] = paVar9;
      uVar10 = (pBVar16->mName)._M_string_length;
      if (uVar10 < 0x400) {
        (paVar9->mNodeName).length = (ai_uint32)uVar10;
        memcpy((paVar9->mNodeName).data,(pBVar16->mName)._M_dataplus._M_p,uVar10);
        (paVar9->mNodeName).data[uVar10] = '\0';
      }
      uVar10 = ((long)(pBVar16->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar16->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
      uVar5 = (uint)uVar10;
      paVar9->mNumRotationKeys = uVar5;
      if (uVar5 != 0) {
        paVar9->mNumPositionKeys = uVar5;
        uVar10 = (uVar10 & 0xffffffff) * 0x18;
        paVar11 = (aiVectorKey *)operator_new__(uVar10);
        uVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar11->mTime + uVar12);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar11->mValue).z + uVar12) = 0;
          uVar12 = uVar12 + 0x18;
        } while (uVar10 != uVar12);
        paVar9->mPositionKeys = paVar11;
        uVar10 = (ulong)paVar9->mNumRotationKeys;
        paVar13 = (aiQuatKey *)operator_new__(uVar10 * 0x18);
        if (uVar10 != 0) {
          paVar14 = paVar13;
          do {
            paVar14->mTime = 0.0;
            (paVar14->mValue).w = 1.0;
            (paVar14->mValue).x = 0.0;
            (paVar14->mValue).y = 0.0;
            (paVar14->mValue).z = 0.0;
            paVar14 = paVar14 + 1;
          } while (paVar14 != paVar13 + uVar10);
        }
        paVar9->mRotationKeys = paVar13;
        pMVar17 = (pBVar16->sAnim).asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pMVar17 !=
            (pBVar16->sAnim).asKeys.
            super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar18 = 0;
          do {
            dVar2 = pMVar17->dTime;
            *(double *)((long)&paVar11->mTime + lVar18) = dVar2;
            *(double *)((long)&paVar13->mTime + lVar18) = dVar2;
            fVar19 = (pMVar17->vRot).y * 0.5;
            fVar23 = (pMVar17->vRot).z * 0.5;
            fVar24 = (pMVar17->vRot).x * 0.5;
            fVar20 = sinf(fVar19);
            fVar19 = cosf(fVar19);
            fVar21 = sinf(fVar23);
            fVar23 = cosf(fVar23);
            fVar22 = sinf(fVar24);
            fVar24 = cosf(fVar24);
            *(float *)((long)&(paVar13->mValue).w + lVar18) =
                 fVar19 * fVar23 * fVar24 + fVar20 * fVar21 * fVar22;
            *(float *)((long)&(paVar13->mValue).x + lVar18) =
                 fVar22 * fVar19 * fVar23 - fVar20 * fVar21 * fVar24;
            *(float *)((long)&(paVar13->mValue).y + lVar18) =
                 fVar20 * fVar24 * fVar23 + fVar19 * fVar22 * fVar21;
            *(float *)((long)&(paVar13->mValue).z + lVar18) =
                 fVar19 * fVar24 * fVar21 - fVar20 * fVar22 * fVar23;
            *(float *)((long)&(paVar11->mValue).z + lVar18) = (pMVar17->vPos).z;
            *(undefined8 *)((long)&(paVar11->mValue).x + lVar18) = *(undefined8 *)&pMVar17->vPos;
            pMVar17 = pMVar17 + 1;
            lVar18 = lVar18 + 0x18;
          } while (pMVar17 !=
                   (pBVar16->sAnim).asKeys.
                   super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      pBVar16 = pBVar16 + 1;
    } while (pBVar16 !=
             (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputAnimation(int index, const std::string &name) {
    aiAnimation*& anim = pScene->mAnimations[index] = new aiAnimation();

    if (name.length()) {
        anim->mName.Set(name.c_str());
    }
    anim->mDuration = dLengthOfAnim;
    anim->mNumChannels = static_cast<unsigned int>( asBones.size() );
    anim->mTicksPerSecond = 25.0; // FIXME: is this correct?

    aiNodeAnim** pp = anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // now build valid keys
    unsigned int a = 0;
    for (std::vector<SMD::Bone>::const_iterator i = asBones.begin(); i != asBones.end(); ++i) {
        aiNodeAnim* p = pp[a] = new aiNodeAnim();

        // copy the name of the bone
        p->mNodeName.Set(i->mName);

        p->mNumRotationKeys = (unsigned int)(*i).sAnim.asKeys.size();
        if (p->mNumRotationKeys){
            p->mNumPositionKeys = p->mNumRotationKeys;
            aiVectorKey* pVecKeys = p->mPositionKeys = new aiVectorKey[p->mNumRotationKeys];
            aiQuatKey* pRotKeys = p->mRotationKeys = new aiQuatKey[p->mNumRotationKeys];

            for (std::vector<SMD::Bone::Animation::MatrixKey>::const_iterator
                    qq = (*i).sAnim.asKeys.begin();
                    qq != (*i).sAnim.asKeys.end(); ++qq) {
                pRotKeys->mTime = pVecKeys->mTime = (*qq).dTime;

                // compute the rotation quaternion from the euler angles
                // aiQuaternion: The order of the parameters is yzx?
                pRotKeys->mValue = aiQuaternion((*qq).vRot.y, (*qq).vRot.z, (*qq).vRot.x);
                pVecKeys->mValue = (*qq).vPos;

                ++pVecKeys; ++pRotKeys;
            }
        }
        ++a;

        // there are no scaling keys ...
    }
}